

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_con.h
# Opt level: O3

void __thiscall
mp::pre::
RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>
::PresolveGenericIntEntry
          (RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>
           *this,LinkEntry *be)

{
  value_type v;
  ValueNode *pVVar1;
  
  pVVar1 = (this->
           super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
           ).ndl_._M_elems[1];
  v = ((this->
       super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
       ).ndl_._M_elems[0]->vi_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[be->_M_elems[0]];
  ValueNode::SetNum<std::vector<int,std::allocator<int>>>
            (pVVar1,&pVVar1->vi_,(long)be->_M_elems[1],v);
  pVVar1 = (this->
           super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
           ).ndl_._M_elems[2];
  ValueNode::SetNum<std::vector<int,std::allocator<int>>>
            (pVVar1,&pVVar1->vi_,(long)be->_M_elems[2],v);
  return;
}

Assistant:

void PresolveGenericIntEntry(const typename Base::LinkEntry& be) {
    auto src_val = GetInt(be, CON_SRC);
    SetInt(be, CON_TARGET, src_val);
    SetInt(be, VAR_SLK, src_val);
  }